

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::SimpleModifier::formatAsPrefixSuffix
          (SimpleModifier *this,NumberStringBuilder *result,int32_t startIndex,int32_t endIndex,
          Field field,UErrorCode *status)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  
  iVar3 = this->fPrefixLength;
  if ((this->fSuffixOffset == -1) &&
     (iVar1 = this->fSuffixLength + iVar3,
     iVar1 != 0 && SCARRY4(this->fSuffixLength,iVar3) == iVar1 < 0)) {
    sVar2 = NumberStringBuilder::splice
                      (result,startIndex,(__off64_t *)(ulong)(uint)endIndex,(int)this + 8,
                       (__off64_t *)0x2,(ulong)(iVar3 + 2),field);
    iVar1 = (int)sVar2;
  }
  else {
    if (0 < iVar3) {
      NumberStringBuilder::insert
                (result,startIndex,&this->fCompiledPattern,2,iVar3 + 2,field,status);
      iVar3 = this->fPrefixLength;
    }
    iVar1 = this->fSuffixLength;
    if (0 < iVar1) {
      NumberStringBuilder::insert
                (result,iVar3 + endIndex,&this->fCompiledPattern,this->fSuffixOffset + 1,
                 this->fSuffixOffset + iVar1 + 1,field,status);
      iVar3 = this->fPrefixLength;
      iVar1 = this->fSuffixLength;
    }
    iVar1 = iVar1 + iVar3;
  }
  return iVar1;
}

Assistant:

int32_t
SimpleModifier::formatAsPrefixSuffix(NumberStringBuilder &result, int32_t startIndex, int32_t endIndex,
                                     Field field, UErrorCode &status) const {
    if (fSuffixOffset == -1 && fPrefixLength + fSuffixLength > 0) {
        // There is no argument for the inner number; overwrite the entire segment with our string.
        return result.splice(startIndex, endIndex, fCompiledPattern, 2, 2 + fPrefixLength, field, status);
    } else {
        if (fPrefixLength > 0) {
            result.insert(startIndex, fCompiledPattern, 2, 2 + fPrefixLength, field, status);
        }
        if (fSuffixLength > 0) {
            result.insert(
                    endIndex + fPrefixLength,
                    fCompiledPattern,
                    1 + fSuffixOffset,
                    1 + fSuffixOffset + fSuffixLength,
                    field,
                    status);
        }
        return fPrefixLength + fSuffixLength;
    }
}